

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall Variable_connectionId_Test::TestBody(Variable_connectionId_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  VariablePtr v2;
  VariablePtr v1;
  AssertHelper aAStack_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  shared_ptr local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  shared_ptr local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence(local_20,local_30);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_((shared_ptr *)&local_60,local_20);
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_40,"\"\"","libcellml::Variable::equivalenceConnectionId(v1, v2)",
             (char (*) [1])0x11903e,&local_60);
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"connection_id","");
  libcellml::Variable::setEquivalenceConnectionId(local_20,local_30,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_((shared_ptr *)&local_60,local_20);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            (local_40,"\"connection_id\"","libcellml::Variable::equivalenceConnectionId(v1, v2)",
             (char (*) [14])"connection_id",&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_60._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Variable, connectionId)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);

    EXPECT_EQ("", libcellml::Variable::equivalenceConnectionId(v1, v2));

    libcellml::Variable::setEquivalenceConnectionId(v1, v2, "connection_id");
    EXPECT_EQ("connection_id", libcellml::Variable::equivalenceConnectionId(v1, v2));
}